

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

void cJSON_AddItemToObject(cJSON *object,char *string,cJSON *item)

{
  byte *pbVar1;
  uchar *string_00;
  
  string_00 = cJSON_strdup((uchar *)string,(internal_hooks *)string);
  cJSON_AddItemToObjectCS(object,(char *)string_00,item);
  pbVar1 = (byte *)((long)&item->type + 1);
  *pbVar1 = *pbVar1 & 0xfd;
  return;
}

Assistant:

CJSON_PUBLIC(void) cJSON_AddItemToObject(cJSON *object, const char *string, cJSON *item)
{
    /* call cJSON_AddItemToObjectCS for code reuse */
    cJSON_AddItemToObjectCS(object, (char*)cJSON_strdup((const unsigned char*)string, &global_hooks), item);
    /* remove cJSON_StringIsConst flag */
    item->type &= ~cJSON_StringIsConst;
}